

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

pair<slang::ast::SubroutineSymbol_*,_bool>
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,FunctionDeclarationSyntax *syntax,Scope *parent,bool outOfBlock)

{
  Token token;
  DiagCode noteCode;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar1;
  bool bVar2;
  SymbolIndex SVar3;
  NameSyntax *pNVar4;
  SyntaxNode *pSVar5;
  FunctionPrototypeSyntax *pFVar6;
  InstanceBodySymbol *this;
  DeclaredType *pDVar7;
  Type *pTVar8;
  VariableSymbol *pVVar9;
  DataTypeSyntax *newType;
  Symbol *this_00;
  SourceLocation this_01;
  FormalArgumentSymbol *pFVar10;
  byte in_CL;
  FunctionDeclarationSyntax *in_RDX;
  undefined8 extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar11;
  Compilation *in_RSI;
  Compilation *in_RDI;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar12;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar13;
  Token TVar14;
  FormalArgumentSymbol *arg;
  Diagnostic *diag;
  bool portListError;
  Symbol *last;
  VariableSymbol *implicitReturnVar;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  SubroutineSymbol *result;
  SubroutineKind subroutineKind;
  Symbol *sym;
  Scope *scope;
  optional<slang::ast::VariableLifetime> lifetime;
  Token nameToken;
  type_conflict2 *_;
  type *result_1;
  ScopedNameSyntax *scopedName;
  bool isExternIfaceMethod;
  Symbol *last_1;
  uint32_t index;
  not_null<slang::syntax::FunctionPrototypeSyntax_*> proto;
  Symbol *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  SymbolIndex in_stack_fffffffffffffca4;
  SourceLocation in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined2 in_stack_fffffffffffffcb4;
  undefined1 in_stack_fffffffffffffcb6;
  undefined1 in_stack_fffffffffffffcb7;
  VariableLifetime *in_stack_fffffffffffffcb8;
  SourceLocation *in_stack_fffffffffffffcc0;
  Scope *in_stack_fffffffffffffcc8;
  Symbol *in_stack_fffffffffffffcd0;
  Compilation *in_stack_fffffffffffffcd8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffce0;
  FunctionPrototypeSyntax *in_stack_fffffffffffffd40;
  SourceLocation in_stack_fffffffffffffd48;
  DataTypeSyntax *in_stack_fffffffffffffd50;
  VariableLifetime defaultLifetime;
  undefined7 in_stack_fffffffffffffdd8;
  bool in_stack_fffffffffffffddf;
  Scope *in_stack_fffffffffffffde0;
  Scope *in_stack_fffffffffffffde8;
  pointer local_210;
  size_t sStack_208;
  Token local_1e0;
  SourceLocation local_1d0;
  undefined4 local_1c4;
  SourceLocation local_1c0;
  undefined4 local_1b4;
  Diagnostic *local_1b0;
  byte local_1a1;
  pointer local_1a0;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_fffffffffffffe68;
  SymbolIndex index_00;
  SyntaxNode *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Scope *in_stack_fffffffffffffe80;
  bitmask<slang::ast::MethodFlags> in_stack_fffffffffffffe88;
  bitmask<slang::ast::MethodFlags> in_stack_fffffffffffffe8a;
  undefined4 in_stack_fffffffffffffe8c;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_168 [2];
  SourceLocation local_118;
  string_view local_110;
  SubroutineSymbol *local_100;
  uint local_f8;
  _Optional_payload_base<slang::ast::VariableLifetime> local_f4;
  undefined4 local_ec;
  _Optional_payload_base<slang::ast::VariableLifetime> local_e8;
  _Optional_payload_base<slang::ast::VariableLifetime> local_e0;
  Symbol *local_d8;
  FunctionDeclarationSyntax *local_d0;
  undefined4 local_c4;
  _Optional_payload_base<slang::ast::VariableLifetime> local_c0;
  undefined8 local_b8;
  Info *local_b0;
  _Optional_payload_base<slang::ast::VariableLifetime> local_a8;
  Token local_a0;
  void *local_90;
  type_conflict2 *local_88;
  type *local_80;
  SubroutineSymbol *local_78;
  undefined1 local_70;
  SubroutineSymbol *local_68;
  undefined1 local_60;
  ScopedNameSyntax *local_58;
  bool local_49;
  Symbol *local_48;
  int local_3c;
  undefined1 outOfBlock_00;
  undefined7 in_stack_ffffffffffffffd0;
  pair<slang::ast::SubroutineSymbol_*,_bool> local_10;
  
  bVar1 = in_CL & 1;
  outOfBlock_00 =
       (undefined1)
       ((ulong)*(undefined8 *)
                &(in_RSI->options).defaultTimeScale.
                 super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_engaged >> 0x38);
  if (bVar1 == 0) {
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x459d99);
    pNVar4 = not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x459da5);
    if ((pNVar4->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
      local_3c = 1;
      local_48 = Scope::getLastMember((Scope *)in_RDX);
      index_00 = (SymbolIndex)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if (local_48 != (Symbol *)0x0) {
        SVar3 = Symbol::getIndex(local_48);
        local_3c = SVar3 + 1;
      }
      local_49 = false;
      not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x459e08);
      pSVar5 = (SyntaxNode *)
               not_null<slang::syntax::NameSyntax_*>::operator->
                         ((not_null<slang::syntax::NameSyntax_*> *)0x459e14);
      local_58 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(pSVar5);
      if ((local_58->separator).kind == DoubleColon) {
        Compilation::addOutOfBlockDecl
                  ((Compilation *)
                   CONCAT44(in_stack_fffffffffffffe8c,
                            CONCAT22(in_stack_fffffffffffffe8a.m_bits,
                                     in_stack_fffffffffffffe88.m_bits)),in_stack_fffffffffffffe80,
                   (ScopedNameSyntax *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                   ,in_stack_fffffffffffffe70,index_00);
      }
      else {
        pVar12 = fromSyntax(in_RSI,in_RDX,(Scope *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                            (bool)outOfBlock_00);
        local_78 = pVar12.first;
        local_70 = pVar12.second;
        local_68 = local_78;
        local_60 = local_70;
        local_80 = std::get<0ul,slang::ast::SubroutineSymbol*,bool>
                             ((pair<slang::ast::SubroutineSymbol_*,_bool> *)0x459ec1);
        local_88 = std::get<1ul,slang::ast::SubroutineSymbol*,bool>
                             ((pair<slang::ast::SubroutineSymbol_*,_bool> *)0x459ed6);
        Symbol::setParent((Symbol *)
                          CONCAT17(in_stack_fffffffffffffcb7,
                                   CONCAT16(in_stack_fffffffffffffcb6,
                                            CONCAT24(in_stack_fffffffffffffcb4,
                                                     in_stack_fffffffffffffcb0))),
                          (Scope *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
        Compilation::addExternInterfaceMethod
                  ((Compilation *)
                   CONCAT17(in_stack_fffffffffffffcb7,
                            CONCAT16(in_stack_fffffffffffffcb6,
                                     CONCAT24(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)))
                   ,(SubroutineSymbol *)in_stack_fffffffffffffca8);
        local_49 = true;
      }
      local_90 = (void *)0x0;
      std::pair<slang::ast::SubroutineSymbol_*,_bool>::pair<std::nullptr_t,_bool_&,_true>
                (&local_10,&local_90,&local_49);
      uVar11 = extraout_RDX;
      goto LAB_0045a97b;
    }
  }
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x459f5a);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x459f66);
  local_a0 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffcd0);
  pFVar6 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                     ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x459f8b);
  local_b8._0_2_ = (pFVar6->lifetime).kind;
  local_b8._2_1_ = (pFVar6->lifetime).field_0x2;
  local_b8._3_1_ = (pFVar6->lifetime).numFlags;
  local_b8._4_4_ = (pFVar6->lifetime).rawLen;
  local_b0 = (pFVar6->lifetime).info;
  token.rawLen = in_stack_fffffffffffffca4;
  token.kind = (short)in_stack_fffffffffffffca0;
  token._2_1_ = (char)((uint)in_stack_fffffffffffffca0 >> 0x10);
  token.numFlags.raw = (char)((uint)in_stack_fffffffffffffca0 >> 0x18);
  token.info = (Info *)in_stack_fffffffffffffca8;
  local_a8 = (_Optional_payload_base<slang::ast::VariableLifetime>)
             SemanticFacts::getVariableLifetime(token);
  bVar2 = std::optional<slang::ast::VariableLifetime>::has_value
                    ((optional<slang::ast::VariableLifetime> *)0x459fcd);
  if (!bVar2) {
    local_c4 = 1;
    local_d0 = in_RDX;
    std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
              ((optional<slang::ast::VariableLifetime> *)
               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               &in_stack_fffffffffffffc98->kind);
    local_a8 = local_c0;
    in_RDX = local_d0;
    do {
      local_d8 = Scope::asSymbol((Scope *)local_d0);
      if (local_d8->kind == InstanceBody) {
        this = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x45a044);
        InstanceBodySymbol::getDefinition(this);
        std::optional<slang::ast::VariableLifetime>::
        optional<const_slang::ast::VariableLifetime_&,_true>
                  ((optional<slang::ast::VariableLifetime> *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   &in_stack_fffffffffffffc98->kind);
        local_a8 = local_e0;
        break;
      }
      if (local_d8->kind == ClassType) {
        local_ec = 0;
        std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
                  ((optional<slang::ast::VariableLifetime> *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   &in_stack_fffffffffffffc98->kind);
        local_a8 = local_e8;
        break;
      }
      if (local_d8->kind == Package) {
        Symbol::as<slang::ast::PackageSymbol>((Symbol *)0x45a0ce);
        std::optional<slang::ast::VariableLifetime>::
        optional<const_slang::ast::VariableLifetime_&,_true>
                  ((optional<slang::ast::VariableLifetime> *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   &in_stack_fffffffffffffc98->kind);
        local_a8 = local_f4;
        break;
      }
      local_d0 = (FunctionDeclarationSyntax *)Symbol::getParentScope(local_d8);
    } while (local_d0 != (FunctionDeclarationSyntax *)0x0);
  }
  local_f8 = (uint)(*(int *)&(in_RSI->super_BumpAllocator).head == 0x1cb);
  local_110 = parsing::Token::valueText
                        ((Token *)CONCAT17(in_stack_fffffffffffffcb7,
                                           CONCAT16(in_stack_fffffffffffffcb6,
                                                    CONCAT24(in_stack_fffffffffffffcb4,
                                                             in_stack_fffffffffffffcb0))));
  local_118 = parsing::Token::location(&local_a0);
  std::optional<slang::ast::VariableLifetime>::operator*
            ((optional<slang::ast::VariableLifetime> *)0x45a194);
  local_100 = BumpAllocator::
              emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::SubroutineKind&>
                        ((BumpAllocator *)in_stack_fffffffffffffce0._M_extent_value,
                         in_stack_fffffffffffffcd8,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffcd0,(SourceLocation *)in_stack_fffffffffffffcc8,
                         (VariableLifetime *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  Symbol::setSyntax(&local_100->super_Symbol,(SyntaxNode *)in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffcb7,
                      CONCAT16(in_stack_fffffffffffffcb6,
                               CONCAT24(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffca8);
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffce0._M_extent_value;
  syntax_00._M_ptr = (pointer)in_stack_fffffffffffffcd8;
  Symbol::setAttributes(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,syntax_00);
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x45a247);
  pFVar6 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                     ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a254);
  if (pFVar6->portList != (FunctionPortListSyntax *)0x0) {
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a2a5);
    defaultLifetime = (VariableLifetime)((ulong)pFVar6 >> 0x20);
    std::optional<slang::ast::VariableLifetime>::operator*
              ((optional<slang::ast::VariableLifetime> *)0x45a2d3);
    buildArguments(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (FunctionPortListSyntax *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),defaultLifetime,
                   (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)in_RDX);
    bitmask<slang::ast::MethodFlags>::operator|=
              (&local_100->flags,(bitmask<slang::ast::MethodFlags> *)&stack0xfffffffffffffe8a);
  }
  if (local_a0.kind == NewKeyword) {
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xfffffffffffffe88,Constructor);
    bitmask<slang::ast::MethodFlags>::operator|=
              (&local_100->flags,(bitmask<slang::ast::MethodFlags> *)&stack0xfffffffffffffe88);
    pDVar7 = &local_100->declaredReturnType;
    pTVar8 = Compilation::getVoidType(in_RDI);
    DeclaredType::setType(pDVar7,pTVar8);
  }
  else if (local_f8 == 0) {
    pVVar9 = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                       ((BumpAllocator *)in_stack_fffffffffffffcd0,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                        in_stack_fffffffffffffcb8);
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a459);
    in_stack_fffffffffffffd50 =
         not_null<slang::syntax::DataTypeSyntax_*>::operator*
                   ((not_null<slang::syntax::DataTypeSyntax_*> *)0x45a474);
    ValueSymbol::setDeclaredType
              ((ValueSymbol *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               (DataTypeSyntax *)in_stack_fffffffffffffc98);
    in_stack_fffffffffffffd48 = (SourceLocation)&stack0xfffffffffffffe7a;
    bitmask<slang::ast::VariableFlags>::bitmask
              ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffd48,CompilerGenerated);
    bitmask<slang::ast::VariableFlags>::operator|=
              (&pVVar9->flags,(bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffd48);
    Scope::addMember((Scope *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc98);
    local_100->returnValVar = pVVar9;
    pDVar7 = &local_100->declaredReturnType;
    in_stack_fffffffffffffd40 =
         not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                   ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a51e);
    newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                        ((not_null<slang::syntax::DataTypeSyntax_*> *)0x45a539);
    DeclaredType::setTypeSyntax(pDVar7,newType);
  }
  else {
    pDVar7 = &local_100->declaredReturnType;
    pTVar8 = Compilation::getVoidType(in_RDI);
    DeclaredType::setType(pDVar7,pTVar8);
  }
  this_00 = Scope::getLastMember(&local_100->super_Scope);
  sVar13 = Statement::createAndAddBlockItems((Scope *)this_00,in_stack_fffffffffffffe68);
  local_1a0 = sVar13._M_ptr;
  local_100->blocks = sVar13;
  if (this_00 == (Symbol *)0x0) {
    this_01 = (SourceLocation)Scope::getFirstMember(&local_100->super_Scope);
    src = extraout_RDX_00;
  }
  else {
    this_01 = (SourceLocation)Symbol::getNextSibling(this_00);
    src = extraout_RDX_01;
  }
  TVar14.info = (Info *)in_stack_fffffffffffffcc8;
  TVar14._0_8_ = in_stack_fffffffffffffcd0;
  local_1a1 = 0;
  while (this_01 != (SourceLocation)0x0) {
    if (*(int *)this_01 == 0x3d) {
      if ((local_1a1 & 1) == 0) {
        pFVar6 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                           ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a6cc);
        pSVar5 = TVar14._0_8_;
        if (pFVar6->portList != (FunctionPortListSyntax *)0x0) {
          local_1b4 = 0x810006;
          local_1c0 = *(SourceLocation *)((long)this_01 + 0x18);
          local_1b0 = Scope::addDiag((Scope *)in_stack_fffffffffffffd40,
                                     SUB84((ulong)in_stack_fffffffffffffd50 >> 0x20,0),
                                     in_stack_fffffffffffffd48);
          local_1c4 = 0x50001;
          not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                    ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x45a75a);
          TVar14 = slang::syntax::SyntaxNode::getFirstToken(pSVar5);
          local_1e0 = TVar14;
          local_1d0 = parsing::Token::location(&local_1e0);
          noteCode.code._0_1_ = in_stack_fffffffffffffcb6;
          noteCode.subsystem = in_stack_fffffffffffffcb4;
          noteCode.code._1_1_ = in_stack_fffffffffffffcb7;
          Diagnostic::addNote((Diagnostic *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),noteCode
                              ,in_stack_fffffffffffffca8);
          local_1a1 = 1;
        }
      }
      pFVar10 = Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0x45a7e9);
      SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                 CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 (FormalArgumentSymbol **)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffcb7 =
           std::operator==((optional<slang::ast::VariableLifetime> *)
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           &in_stack_fffffffffffffc98->kind);
      in_stack_fffffffffffffcb6 = false;
      if ((bool)in_stack_fffffffffffffcb7) {
        in_stack_fffffffffffffcb6 = pFVar10->direction == Ref;
      }
      if ((bool)in_stack_fffffffffffffcb6 != false) {
        Scope::addDiag((Scope *)in_stack_fffffffffffffd40,
                       SUB84((ulong)in_stack_fffffffffffffd50 >> 0x20,0),in_stack_fffffffffffffd48);
      }
    }
    in_stack_fffffffffffffca8 = (SourceLocation)Symbol::getNextSibling((Symbol *)this_01);
    src = extraout_RDX_02;
    this_01 = in_stack_fffffffffffffca8;
  }
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
            (local_168,(EVP_PKEY_CTX *)in_RDI,src);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffcb7,
                      CONCAT16(in_stack_fffffffffffffcb6,
                               CONCAT24(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))),
             (span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffca8);
  (local_100->arguments)._M_ptr = local_210;
  (local_100->arguments)._M_extent._M_extent_value = sStack_208;
  std::pair<slang::ast::SubroutineSymbol_*,_bool>::pair<slang::ast::SubroutineSymbol_*&,_bool,_true>
            (&local_10,&local_100,(bool *)&stack0xfffffffffffffddf);
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x45a97b);
  uVar11 = extraout_RDX_03;
LAB_0045a97b:
  pVar12._9_7_ = (undefined7)((ulong)uVar11 >> 8);
  pVar12.second = local_10.second;
  pVar12.first = local_10.first;
  return pVar12;
}

Assistant:

std::pair<SubroutineSymbol*, bool> SubroutineSymbol::fromSyntax(
    Compilation& compilation, const FunctionDeclarationSyntax& syntax, const Scope& parent,
    bool outOfBlock) {

    // If this subroutine has a scoped name, it should be an out of block declaration.
    // We shouldn't create a symbol now, since we need the class prototype to hook
    // us in to the correct scope. Register this syntax with the compilation so that
    // it can later be found by the prototype.
    auto proto = syntax.prototype;
    if (!outOfBlock && proto->name->kind == SyntaxKind::ScopedName) {
        // Remember the location in the parent scope where we *would* have inserted this
        // subroutine, for later use during lookup.
        uint32_t index = 1;
        if (auto last = parent.getLastMember())
            index = (uint32_t)last->getIndex() + 1;

        bool isExternIfaceMethod = false;
        auto& scopedName = proto->name->as<ScopedNameSyntax>();
        if (scopedName.separator.kind == TokenKind::DoubleColon) {
            // This is an out-of-block class method implementation.
            compilation.addOutOfBlockDecl(parent, scopedName, syntax, SymbolIndex(index));
        }
        else {
            // Otherwise this is an interface method implementation.
            // We should create the method like normal but not add it to
            // the parent name map (because it can only be looked up via
            // the interface instance).
            auto [result, _] = SubroutineSymbol::fromSyntax(compilation, syntax, parent,
                                                            /* outOfBlock */ true);
            SLANG_ASSERT(result);

            result->setParent(parent, SymbolIndex(index));
            compilation.addExternInterfaceMethod(*result);
            isExternIfaceMethod = true;
        }
        return {nullptr, isExternIfaceMethod};
    }

    Token nameToken = proto->name->getLastToken();
    auto lifetime = SemanticFacts::getVariableLifetime(proto->lifetime);
    if (!lifetime.has_value()) {
        // Walk up to the nearest instance and use its default lifetime.
        // If we're not within an instance, default to static.
        lifetime = VariableLifetime::Static;
        auto scope = &parent;
        do {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody) {
                lifetime = sym.as<InstanceBodySymbol>().getDefinition().defaultLifetime;
                break;
            }
            else if (sym.kind == SymbolKind::ClassType) {
                lifetime = VariableLifetime::Automatic;
                break;
            }
            else if (sym.kind == SymbolKind::Package) {
                lifetime = sym.as<PackageSymbol>().defaultLifetime;
                break;
            }
            scope = sym.getParentScope();
        } while (scope);
    }

    auto subroutineKind = syntax.kind == SyntaxKind::TaskDeclaration ? SubroutineKind::Task
                                                                     : SubroutineKind::Function;
    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(), *lifetime,
                                                        subroutineKind);

    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto->portList)
        result->flags |= buildArguments(*result, parent, *proto->portList, *lifetime, arguments);

    if (nameToken.kind == TokenKind::NewKeyword) {
        result->flags |= MethodFlags::Constructor;
        result->declaredReturnType.setType(compilation.getVoidType());
    }
    else if (subroutineKind == SubroutineKind::Function) {
        // The function gets an implicit variable inserted that represents the return value.
        auto implicitReturnVar = compilation.emplace<VariableSymbol>(result->name, result->location,
                                                                     VariableLifetime::Automatic);
        implicitReturnVar->setDeclaredType(*proto->returnType);
        implicitReturnVar->flags |= VariableFlags::CompilerGenerated;
        result->addMember(*implicitReturnVar);
        result->returnValVar = implicitReturnVar;
        result->declaredReturnType.setTypeSyntax(*proto->returnType);
    }
    else {
        result->declaredReturnType.setType(compilation.getVoidType());
    }

    const Symbol* last = result->getLastMember();
    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);

    // Subroutines can also declare arguments inside their bodies as port declarations.
    // Find them by walking through members that were added by setItems().
    if (!last)
        last = result->getFirstMember();
    else
        last = last->getNextSibling();

    bool portListError = false;
    while (last) {
        if (last->kind == SymbolKind::FormalArgument) {
            if (!portListError && proto->portList) {
                auto& diag = parent.addDiag(diag::MixingSubroutinePortKinds, last->location);
                diag.addNote(diag::NoteDeclarationHere,
                             proto->portList->getFirstToken().location());
                portListError = true;
            }

            auto& arg = last->as<FormalArgumentSymbol>();
            arguments.push_back(&arg);

            if (lifetime == VariableLifetime::Static && arg.direction == ArgumentDirection::Ref)
                parent.addDiag(diag::RefArgAutomaticFunc, last->location);
        }
        last = last->getNextSibling();
    }

    result->arguments = arguments.copy(compilation);
    return {result, false};
}